

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
enqueue_event<vending::events::load_done>
          (state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,load_done *event)

{
  id_type *local_38;
  anon_class_16_2_20c42392 local_30;
  no_lock local_19;
  load_done evt;
  load_done *plStack_18;
  lock_guard lock;
  load_done *event_local;
  state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  *this_local;
  
  plStack_18 = event;
  detail::no_lock::no_lock(&local_19,(none *)&this->field_0x138);
  std::__atomic_base<unsigned_long>::operator++
            (&(this->queue_size_).super___atomic_base<unsigned_long>);
  detail::null_observer::
  enqueue_event<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::events::load_done>
            ((null_observer *)this,this,plStack_18);
  local_38 = (id_type *)&detail::event<vending::events::load_done>::id;
  local_30.this = this;
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::enqueue_event<vending::events::load_done>(vending::events::load_done&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->queued_events_,&local_30,&local_38);
  process_event_queue(this);
  return;
}

Assistant:

void
    enqueue_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;
        {
            lock_guard lock{mutex_};
            ++queue_size_;
            observer_wrapper::enqueue_event(*this, ::std::forward<Event>(event));
            Event evt{::std::forward<Event>(event)};
            queued_events_.emplace_back([&, evt]() mutable {
                return process_event_dispatch(::std::move(evt));
            }, &evt_identity::id);
        }
        // Process enqueued events in case we've been waiting for queue
        // mutex release
        process_event_queue();
    }